

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O3

void concept_suite::random_access_iterator_subtraction(void)

{
  ulong uVar1;
  ulong uVar2;
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> data;
  undefined4 local_44;
  vector<int,_std::allocator<int>_> local_40;
  long local_28 [3];
  
  local_28[0] = 0x160000000b;
  local_28[1] = 0x2c00000021;
  __l._M_len = 4;
  __l._M_array = (iterator)local_28;
  std::vector<int,_std::allocator<int>_>::vector(&local_40,__l,(allocator_type *)&local_44);
  uVar1 = (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2;
  uVar2 = (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start >> 1;
  if ((uVar2 & uVar2 - 1) == 0) {
    uVar1 = uVar2 - 1 & uVar1;
  }
  else {
    uVar1 = uVar1 % uVar2;
  }
  local_28[0] = uVar1 - 2;
  local_44 = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), a)","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0xd1,"void concept_suite::random_access_iterator_subtraction()",local_28,
             (allocator_type *)&local_44);
  if (local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void random_access_iterator_subtraction()
{
    // a - n
    std::vector<int> data = { 11, 22, 33, 44 };
    circular_view<int> span(data.begin(), data.end(), data.begin(), data.size());
    circular_view<int>::iterator a = span.end() - 2;
    BOOST_TEST_EQ(std::distance(span.begin(), a), 2);
}